

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<0>>,testing::Matcher<BasicTestExpr<0>>>,std::tuple<BasicTestExpr<2>,BasicTestExpr<0>,BasicTestExpr<0>>>
               (tuple<testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
                *matcher_tuple,
               tuple<BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>_> *value_tuple)

{
  MatcherInterface<BasicTestExpr<2>_> *pMVar1;
  MatcherInterface<BasicTestExpr<0>_> *pMVar2;
  char cVar3;
  undefined1 uVar4;
  
  pMVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
           ).super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
           super_MatcherBase<BasicTestExpr<2>_>.impl_.value_;
  cVar3 = (**(code **)(*(long *)pMVar1 + 0x20))
                    (pMVar1,(value_tuple->
                            super__Tuple_impl<0UL,_BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>_>
                            ).super__Head_base<0UL,_BasicTestExpr<2>,_false>);
  if (cVar3 == '\0') {
    uVar4 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
             .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false>._M_head_impl.
             super_MatcherBase<BasicTestExpr<0>_>.impl_.value_;
    uVar4 = (**(code **)(*(long *)pMVar2 + 0x20))
                      (pMVar2,(value_tuple->
                              super__Tuple_impl<0UL,_BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>_>
                              ).super__Tuple_impl<1UL,_BasicTestExpr<0>,_BasicTestExpr<0>_>.
                              super__Head_base<1UL,_BasicTestExpr<0>,_false>);
  }
  return (bool)uVar4;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }